

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkrequest.cpp
# Opt level: O3

void __thiscall
QNetworkHeadersPrivate::parseAndSetHeader
          (QNetworkHeadersPrivate *this,QByteArrayView key,QByteArrayView value)

{
  KnownHeaders parsedKey;
  KnownHeaders key_00;
  
  key_00 = parseHeaderName(key);
  if (key_00 != ~ContentTypeHeader) {
    parseAndSetHeader(this,key_00,value);
    return;
  }
  return;
}

Assistant:

void QNetworkHeadersPrivate::parseAndSetHeader(QByteArrayView key, QByteArrayView value)
{
    // is it a known header?
    const int parsedKeyAsInt = parseHeaderName(key);
    if (parsedKeyAsInt != -1) {
        const QNetworkRequest::KnownHeaders parsedKey
                = static_cast<QNetworkRequest::KnownHeaders>(parsedKeyAsInt);
        parseAndSetHeader(parsedKey, value);
    }
}